

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O2

VP8StatusCode IDecode(WebPIDecoder *idec)

{
  size_t *psVar1;
  VP8BitReader *token_br;
  uint8_t **ppuVar2;
  VP8MB VVar3;
  VP8MB VVar4;
  WebPDecBuffer *pWVar5;
  void *pvVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  undefined8 uVar11;
  DecState DVar12;
  int iVar13;
  VP8StatusCode VVar14;
  VP8StatusCode VVar15;
  VP8LDecoder *pVVar16;
  size_t sVar17;
  VP8Decoder *pVVar18;
  uint8_t *puVar19;
  WebPWorkerInterface *pWVar20;
  uint uVar21;
  VP8StatusCode in_ESI;
  ulong uVar22;
  VP8Io *pVVar23;
  VP8Decoder *pVVar24;
  VP8Io *pVVar25;
  VP8BitReader *pVVar26;
  size_t sVar27;
  uint3 *data;
  ulong uVar28;
  int local_7c;
  int width;
  undefined4 uStack_74;
  undefined8 uStack_70;
  int iStack_68;
  undefined4 local_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  int local_38;
  
  DVar12 = idec->state;
  if (DVar12 == STATE_WEBP_HEADER) {
    uStack_70 = (idec->mem).start;
    puVar19 = (idec->mem).buf + uStack_70;
    uStack_70 = (idec->mem).end - uStack_70;
    width = (int)puVar19;
    uStack_74 = (undefined4)((ulong)puVar19 >> 0x20);
    iStack_68 = 0;
    VVar15 = WebPParseHeaders((WebPHeaderStructure *)&width);
    if (VVar15 == VP8_STATUS_OK) {
      idec->chunk_size = CONCAT44(uStack_44,uStack_48);
      idec->is_lossless = local_38;
      if (local_38 == 0) {
        pVVar18 = VP8New();
        if (pVVar18 == (VP8Decoder *)0x0) goto LAB_00109842;
        pVVar18->incremental = 1;
        idec->dec = pVVar18;
        pVVar18->alpha_data = (uint8_t *)CONCAT44(uStack_54,uStack_58);
        pVVar18->alpha_data_size = CONCAT44(uStack_4c,uStack_50);
        sVar27 = (idec->mem).end;
        sVar17 = (idec->mem).start + CONCAT44(uStack_5c,uStack_60);
        idec->state = STATE_VP8_HEADER;
        (idec->mem).start = sVar17;
        (idec->io).data = (idec->mem).buf + sVar17;
        (idec->io).data_size = sVar27 - sVar17;
      }
      else {
        pVVar16 = VP8LNew();
        if (pVVar16 == (VP8LDecoder *)0x0) {
LAB_00109842:
          VVar15 = VP8_STATUS_OUT_OF_MEMORY;
          goto LAB_00109845;
        }
        idec->dec = pVVar16;
        sVar27 = (idec->mem).end;
        sVar17 = (idec->mem).start + CONCAT44(uStack_5c,uStack_60);
        idec->state = STATE_VP8L_HEADER;
        (idec->mem).start = sVar17;
        (idec->io).data = (idec->mem).buf + sVar17;
        (idec->io).data_size = sVar27 - sVar17;
      }
      VVar15 = VP8_STATUS_OK;
    }
    else if (VVar15 == VP8_STATUS_NOT_ENOUGH_DATA) {
      VVar15 = VP8_STATUS_SUSPENDED;
    }
    else {
      IDecError(idec,in_ESI);
    }
LAB_00109845:
    DVar12 = idec->state;
  }
  else {
    VVar15 = VP8_STATUS_SUSPENDED;
    if (idec->dec == (void *)0x0) {
      return VP8_STATUS_SUSPENDED;
    }
  }
  if (DVar12 == STATE_VP8_HEADER) {
    sVar27 = (idec->mem).start;
    uVar28 = (idec->mem).end - sVar27;
    if (uVar28 < 10) {
      VVar15 = VP8_STATUS_SUSPENDED;
      DVar12 = STATE_VP8_HEADER;
    }
    else {
      data = (uint3 *)((idec->mem).buf + sVar27);
      uVar22 = uVar28;
      iVar13 = VP8GetInfo((uint8_t *)data,uVar28,idec->chunk_size,&width,&local_7c);
      in_ESI = (VP8StatusCode)uVar22;
      if (iVar13 == 0) {
        IDecError(idec,in_ESI);
        DVar12 = idec->state;
        VVar15 = VP8_STATUS_BITSTREAM_ERROR;
      }
      else {
        (idec->mem).part0_size = (ulong)((*data >> 5) + 10);
        (idec->io).data = (uint8_t *)data;
        (idec->io).data_size = uVar28;
        idec->state = STATE_VP8_PARTS0;
        VVar15 = VP8_STATUS_OK;
        DVar12 = STATE_VP8_PARTS0;
      }
    }
  }
  if ((DVar12 == STATE_VP8_PARTS0) &&
     (VVar15 = VP8_STATUS_SUSPENDED, (idec->mem).part0_size <= (idec->mem).end - (idec->mem).start))
  {
    pWVar5 = (idec->params).output;
    pVVar18 = (VP8Decoder *)idec->dec;
    pVVar25 = &idec->io;
    pVVar23 = pVVar25;
    iVar13 = VP8GetHeaders(pVVar18,pVVar25);
    in_ESI = (VP8StatusCode)pVVar23;
    if (iVar13 == 0) {
      VVar14 = pVVar18->status;
      if ((pVVar18->status & ~VP8_STATUS_INVALID_PARAM) == VP8_STATUS_SUSPENDED) goto LAB_00109a43;
    }
    else {
      in_ESI = (idec->io).height;
      VVar14 = WebPAllocateDecBuffer((idec->io).width,in_ESI,(idec->params).options,pWVar5);
      pVVar18->status = VVar14;
      if (VVar14 == VP8_STATUS_OK) {
        iVar13 = VP8GetThreadMethod((idec->params).options,(WebPHeaderStructure *)0x0,
                                    (idec->io).width,(idec->io).height);
        pVVar18->mt_method = iVar13;
        pVVar24 = pVVar18;
        VP8InitDithering((idec->params).options,pVVar18);
        in_ESI = (VP8StatusCode)pVVar24;
        pvVar6 = idec->dec;
        sVar27 = *(long *)((long)pvVar6 + 0x28) - *(long *)((long)pvVar6 + 0x20);
        if (sVar27 == 0) {
          VVar14 = VP8_STATUS_BITSTREAM_ERROR;
LAB_00109a32:
          pVVar18->status = VVar14;
        }
        else {
          if ((idec->mem).mode == MEM_MODE_APPEND) {
            sVar17 = sVar27;
            puVar19 = (uint8_t *)WebPSafeMalloc(1,sVar27);
            in_ESI = (VP8StatusCode)sVar17;
            if (puVar19 == (uint8_t *)0x0) {
              VVar14 = VP8_STATUS_OUT_OF_MEMORY;
              goto LAB_00109a32;
            }
            memcpy(puVar19,*(void **)((long)pvVar6 + 0x20),sVar27);
            (idec->mem).part0_buf = puVar19;
            VP8BitReaderSetBuffer((VP8BitReader *)((long)pvVar6 + 0x10),puVar19,sVar27);
          }
          psVar1 = &(idec->mem).start;
          *psVar1 = *psVar1 + sVar27;
          pVVar18->status = VP8_STATUS_OK;
          pVVar23 = pVVar25;
          VVar15 = VP8EnterCritical(pVVar18,pVVar25);
          in_ESI = (VP8StatusCode)pVVar23;
          if (VVar15 == VP8_STATUS_OK) {
            idec->state = STATE_VP8_DATA;
            iVar13 = VP8InitFrame(pVVar18,pVVar25);
            in_ESI = (VP8StatusCode)pVVar25;
            VVar15 = VP8_STATUS_OK;
            if (iVar13 != 0) goto LAB_00109a43;
          }
          VVar14 = pVVar18->status;
        }
      }
    }
    VVar15 = VVar14;
    IDecError(idec,in_ESI);
  }
LAB_00109a43:
  DVar12 = idec->state;
  if (DVar12 == STATE_VP8_DATA) {
    pVVar18 = (VP8Decoder *)idec->dec;
    if (pVVar18 == (VP8Decoder *)0x0) {
      return VP8_STATUS_SUSPENDED;
    }
    if (pVVar18->ready == 0) {
LAB_00109c60:
      IDecError(idec,in_ESI);
      VVar15 = VP8_STATUS_BITSTREAM_ERROR;
    }
    else {
      pVVar25 = &idec->io;
      iVar13 = pVVar18->mb_y;
      while (iVar13 < pVVar18->mb_h) {
        if (idec->last_mb_y != iVar13) {
          pVVar24 = pVVar18;
          iVar13 = VP8ParseIntraModeRow(&pVVar18->br,pVVar18);
          in_ESI = (VP8StatusCode)pVVar24;
          if (iVar13 == 0) goto LAB_00109c60;
          idec->last_mb_y = pVVar18->mb_y;
        }
        iVar13 = pVVar18->mb_x;
        while (iVar13 < pVVar18->mb_w) {
          uVar21 = pVVar18->num_parts_minus_one & pVVar18->mb_y;
          token_br = pVVar18->parts + uVar21;
          VVar3 = pVVar18->mb_info[-1];
          VVar4 = pVVar18->mb_info[iVar13];
          pVVar26 = pVVar18->parts + uVar21;
          uVar7 = pVVar26->range;
          uVar8 = pVVar26->bits;
          ppuVar2 = &pVVar18->parts[uVar21].buf;
          puVar19 = *ppuVar2;
          puVar9 = ppuVar2[1];
          ppuVar2 = &pVVar18->parts[uVar21].buf_max;
          puVar10 = *ppuVar2;
          uVar11 = ppuVar2[1];
          uStack_54 = SUB84(puVar10,0);
          uStack_50 = (undefined4)((ulong)puVar10 >> 0x20);
          uStack_4c = (undefined4)uVar11;
          uStack_48 = (undefined4)((ulong)uVar11 >> 0x20);
          local_64 = SUB84(puVar19,0);
          uStack_60 = (undefined4)((ulong)puVar19 >> 0x20);
          uStack_5c = SUB84(puVar9,0);
          uStack_58 = (undefined4)((ulong)puVar9 >> 0x20);
          uStack_74 = (undefined4)pVVar26->value;
          uStack_70._0_4_ = (undefined4)(pVVar26->value >> 0x20);
          pVVar26 = token_br;
          uStack_70._4_4_ = uVar7;
          iStack_68 = uVar8;
          iVar13 = VP8DecodeMB(pVVar18,token_br);
          in_ESI = (VP8StatusCode)pVVar26;
          if (iVar13 == 0) {
            if ((pVVar18->num_parts_minus_one == 0) &&
               (0x1000 < (idec->mem).end - (idec->mem).start)) goto LAB_00109c60;
            if (0 < pVVar18->mt_method) {
              pWVar20 = WebPGetWorkerInterface();
              iVar13 = (*pWVar20->Sync)(&pVVar18->worker);
              if (iVar13 == 0) goto LAB_00109c60;
            }
            pVVar18->mb_info[-1] = VVar3;
            pVVar18->mb_info[pVVar18->mb_x] = VVar4;
            token_br->buf_max = (uint8_t *)CONCAT44(uStack_50,uStack_54);
            *(ulong *)&token_br->eof = CONCAT44(uStack_48,uStack_4c);
            token_br->buf = (uint8_t *)CONCAT44(uStack_60,local_64);
            token_br->buf_end = (uint8_t *)CONCAT44(uStack_58,uStack_5c);
            token_br->value = CONCAT44((undefined4)uStack_70,uStack_74);
            token_br->range = uStack_70._4_4_;
            token_br->bits = iStack_68;
            VVar15 = VP8_STATUS_SUSPENDED;
            goto LAB_00109c6b;
          }
          if (pVVar18->num_parts_minus_one == 0) {
            (idec->mem).start = (long)token_br->buf - (long)(idec->mem).buf;
          }
          iVar13 = pVVar18->mb_x + 1;
          pVVar18->mb_x = iVar13;
        }
        VP8InitScanline(pVVar18);
        pVVar23 = pVVar25;
        iVar13 = VP8ProcessRow(pVVar18,pVVar25);
        VVar15 = (VP8StatusCode)pVVar23;
        if (iVar13 == 0) goto LAB_00109da3;
        iVar13 = pVVar18->mb_y + 1;
        pVVar18->mb_y = iVar13;
      }
      iVar13 = VP8ExitCritical(pVVar18,pVVar25);
      VVar15 = (VP8StatusCode)pVVar25;
      if (iVar13 == 0) {
        idec->state = STATE_ERROR;
LAB_00109da3:
        IDecError(idec,VVar15);
        VVar15 = VP8_STATUS_USER_ABORT;
      }
      else {
        pVVar18->ready = 0;
        VVar15 = FinishDecoding(idec);
      }
    }
LAB_00109c6b:
    DVar12 = idec->state;
  }
  if (DVar12 == STATE_VP8L_HEADER) {
    uVar28 = (idec->mem).end - (idec->mem).start;
    pVVar16 = (VP8LDecoder *)idec->dec;
    if (uVar28 < idec->chunk_size >> 3) {
      pVVar16->status = VP8_STATUS_SUSPENDED;
      VVar15 = VP8_STATUS_SUSPENDED;
    }
    else {
      pWVar5 = (idec->params).output;
      iVar13 = VP8LDecodeHeader(pVVar16,&idec->io);
      if (iVar13 == 0) {
        VVar15 = pVVar16->status;
        if (VVar15 == VP8_STATUS_BITSTREAM_ERROR) {
          if (uVar28 < idec->chunk_size) {
            pVVar16->status = VP8_STATUS_SUSPENDED;
            VVar15 = VP8_STATUS_SUSPENDED;
          }
          else {
            VVar15 = VP8_STATUS_BITSTREAM_ERROR;
          }
        }
        VVar15 = ErrorStatusLossless(idec,VVar15);
      }
      else {
        VVar14 = (idec->io).height;
        VVar15 = WebPAllocateDecBuffer((idec->io).width,VVar14,(idec->params).options,pWVar5);
        pVVar16->status = VVar15;
        if (VVar15 == VP8_STATUS_OK) {
          idec->state = STATE_VP8L_DATA;
          goto LAB_00109d37;
        }
        IDecError(idec,VVar14);
      }
    }
  }
  if (idec->state != STATE_VP8L_DATA) {
    return VVar15;
  }
LAB_00109d37:
  pVVar16 = (VP8LDecoder *)idec->dec;
  pVVar16->incremental = (uint)((idec->mem).end - (idec->mem).start < idec->chunk_size);
  iVar13 = VP8LDecodeImage(pVVar16);
  if (iVar13 == 0) {
    VVar15 = ErrorStatusLossless(idec,pVVar16->status);
  }
  else {
    VVar15 = VP8_STATUS_SUSPENDED;
    if (pVVar16->status != VP8_STATUS_SUSPENDED) {
      VVar15 = FinishDecoding(idec);
    }
  }
  return VVar15;
}

Assistant:

static VP8StatusCode IDecode(WebPIDecoder* idec) {
  VP8StatusCode status = VP8_STATUS_SUSPENDED;

  if (idec->state == STATE_WEBP_HEADER) {
    status = DecodeWebPHeaders(idec);
  } else {
    if (idec->dec == NULL) {
      return VP8_STATUS_SUSPENDED;    // can't continue if we have no decoder.
    }
  }
  if (idec->state == STATE_VP8_HEADER) {
    status = DecodeVP8FrameHeader(idec);
  }
  if (idec->state == STATE_VP8_PARTS0) {
    status = DecodePartition0(idec);
  }
  if (idec->state == STATE_VP8_DATA) {
    const VP8Decoder* const dec = (VP8Decoder*)idec->dec;
    if (dec == NULL) {
      return VP8_STATUS_SUSPENDED;  // can't continue if we have no decoder.
    }
    status = DecodeRemaining(idec);
  }
  if (idec->state == STATE_VP8L_HEADER) {
    status = DecodeVP8LHeader(idec);
  }
  if (idec->state == STATE_VP8L_DATA) {
    status = DecodeVP8LData(idec);
  }
  return status;
}